

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_extension.cc
# Opt level: O2

void anon_unknown.dwarf_4627a::PrintHeader(MallocExtensionWriter *writer,char *label,void **entries)

{
  uintptr_t count;
  uintptr_t size;
  
  size = 0;
  count = 0;
  for (; *entries != (void *)0x0; entries = entries + (long)entries[2] + 3) {
    count = count + (long)*entries;
    size = size + (long)entries[1];
  }
  std::__cxx11::string::append((char *)writer,0x133c59);
  PrintCountAndSize(writer,count,size);
  std::__cxx11::string::append((char *)writer,0x132ce7);
  strlen(label);
  std::__cxx11::string::append((char *)writer,(ulong)label);
  std::__cxx11::string::append((char *)writer,0x1323b7);
  return;
}

Assistant:

void PrintHeader(MallocExtensionWriter* writer,
                 const char* label, void** entries) {
  // Compute the total count and total size
  uintptr_t total_count = 0;
  uintptr_t total_size = 0;
  for (void** entry = entries; Count(entry) != 0; entry += 3 + Depth(entry)) {
    total_count += Count(entry);
    total_size += Size(entry);
  }

  const char* const kTitle = "heap profile: ";
  writer->append(kTitle, strlen(kTitle));
  PrintCountAndSize(writer, total_count, total_size);
  writer->append(" ", 1);
  writer->append(label, strlen(label));
  writer->append("\n", 1);
}